

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readComment(Reader *this)

{
  Location pCVar1;
  Char CVar2;
  Reader *in_RDI;
  CommentPlacement placement;
  bool successful;
  Char c;
  Location commentBegin;
  Location in_stack_00000020;
  Location in_stack_00000028;
  Reader *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  bool bVar3;
  bool local_1;
  
  pCVar1 = in_RDI->current_;
  CVar2 = getNextChar(in_RDI);
  bVar3 = false;
  if (CVar2 == '*') {
    bVar3 = readCStyleComment((Reader *)
                              CONCAT17(0x2a,(uint7)CONCAT24(in_stack_ffffffffffffffe4,
                                                            in_stack_ffffffffffffffe0)));
  }
  else if (CVar2 == '/') {
    bVar3 = readCppStyleComment((Reader *)
                                CONCAT17(0x2f,(uint7)CONCAT24(in_stack_ffffffffffffffe4,
                                                              in_stack_ffffffffffffffe0)));
  }
  if (bVar3 == false) {
    local_1 = false;
  }
  else {
    if ((in_RDI->collectComments_ & 1U) != 0) {
      if (((in_RDI->lastValueEnd_ != (Location)0x0) &&
          (bVar3 = containsNewLine(in_RDI->lastValueEnd_,pCVar1 + -1), !bVar3)) && (CVar2 == '*')) {
        containsNewLine(pCVar1 + -1,in_RDI->current_);
      }
      addComment(in_stack_00000030,in_stack_00000028,in_stack_00000020,this._4_4_);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Reader::readComment() {
  Location commentBegin = current_ - 1;
  Char c = getNextChar();
  bool successful = false;
  if (c == '*')
    successful = readCStyleComment();
  else if (c == '/')
    successful = readCppStyleComment();
  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;
    if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
      if (c != '*' || !containsNewLine(commentBegin, current_))
        placement = commentAfterOnSameLine;
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}